

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdblob.cpp
# Opt level: O0

SQUserPointer sqstd_createblob(HSQUIRRELVM v,SQInteger size)

{
  long lVar1;
  SQUserPointer pvVar2;
  undefined8 in_RSI;
  undefined8 in_RDI;
  SQBlob *blob;
  SQInteger top;
  SQBlob *local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_20 = sq_gettop(in_RDI);
  sq_pushregistrytable(local_10);
  sq_pushstring(local_10,"std_blob",0xffffffffffffffff);
  lVar1 = sq_get(local_10,0xfffffffffffffffe);
  if (-1 < lVar1) {
    sq_remove(local_10,0xfffffffffffffffe);
    sq_push(local_10,1);
    sq_pushinteger(local_10,local_18);
    local_28 = (SQBlob *)0x0;
    lVar1 = sq_call(local_10,2,1,0);
    if ((-1 < lVar1) &&
       (lVar1 = sq_getinstanceup(local_10,0xffffffffffffffff,&local_28,0x80000002), -1 < lVar1)) {
      sq_remove(local_10,0xfffffffffffffffe);
      pvVar2 = SQBlob::GetBuf(local_28);
      return pvVar2;
    }
  }
  sq_settop(local_10,local_20);
  return (SQUserPointer)0x0;
}

Assistant:

SQUserPointer sqstd_createblob(HSQUIRRELVM v, SQInteger size)
{
    SQInteger top = sq_gettop(v);
    sq_pushregistrytable(v);
    sq_pushstring(v,_SC("std_blob"),-1);
    if(SQ_SUCCEEDED(sq_get(v,-2))) {
        sq_remove(v,-2); //removes the registry
        sq_push(v,1); // push the this
        sq_pushinteger(v,size); //size
        SQBlob *blob = NULL;
        if(SQ_SUCCEEDED(sq_call(v,2,SQTrue,SQFalse))
            && SQ_SUCCEEDED(sq_getinstanceup(v,-1,(SQUserPointer *)&blob,(SQUserPointer)SQSTD_BLOB_TYPE_TAG))) {
            sq_remove(v,-2);
            return blob->GetBuf();
        }
    }
    sq_settop(v,top);
    return NULL;
}